

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O1

QpSolverStatus __thiscall
Basis::activate(Basis *this,Settings *settings,HighsInt conid,BasisStatus newstatus,
               HighsInt nonactivetoremove,Pricing *pricing)

{
  int iVar1;
  iterator __position;
  pointer piVar2;
  QpSolverStatus QVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  mapped_type *pmVar5;
  uint local_3c;
  HighsInt local_38;
  HighsInt local_34;
  
  local_3c = conid;
  local_38 = nonactivetoremove;
  local_34 = conid;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_34);
  if (_Var4._M_current ==
      (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pmVar5 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](&this->basisstatus,&local_38);
    *pmVar5 = kInactive;
    pmVar5 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](&this->basisstatus,(key_type_conflict1 *)&local_3c);
    *pmVar5 = newstatus;
    __position._M_current =
         (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->active_constraint_index,__position,
                 (int *)&local_3c);
    }
    else {
      *__position._M_current = local_3c;
      (this->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar1 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[local_38];
    (this->baseindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = local_3c;
    remove<int>(&this->non_active_constraint_index,&local_38);
    updatebasis(this,settings,local_3c,local_38,pricing);
    QVar3 = OK;
    if (this->updatessinceinvert != 0) {
      piVar2 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar2[local_38] = -1;
      piVar2[(int)local_3c] = iVar1;
      QVar3 = OK;
    }
  }
  else {
    printf("Degeneracy? constraint %d already in basis\n",(ulong)local_3c);
    QVar3 = DEGENERATE;
  }
  return QVar3;
}

Assistant:

QpSolverStatus Basis::activate(const Settings& settings, HighsInt conid,
                               BasisStatus newstatus,
                               HighsInt nonactivetoremove, Pricing* pricing) {
  // printf("activ %" HIGHSINT_FORMAT "\n", conid);
  if (!contains(active_constraint_index, (HighsInt)conid)) {
    basisstatus[nonactivetoremove] = BasisStatus::kInactive;
    basisstatus[conid] = newstatus;
    active_constraint_index.push_back(conid);
  } else {
    printf("Degeneracy? constraint %" HIGHSINT_FORMAT " already in basis\n",
           conid);
    return QpSolverStatus::DEGENERATE;
  }

  // printf("drop %d\n", nonactivetoremove);
  // remove non-active row from basis
  HighsInt rowtoremove = constraintindexinbasisfactor[nonactivetoremove];

  baseindex[rowtoremove] = conid;
  remove(non_active_constraint_index, nonactivetoremove);
  updatebasis(settings, conid, nonactivetoremove, pricing);

  if (updatessinceinvert != 0) {
    constraintindexinbasisfactor[nonactivetoremove] = -1;
    constraintindexinbasisfactor[conid] = rowtoremove;
  }
  return QpSolverStatus::OK;
}